

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QAbstractEventDispatcher::TimerInfoV2>::begin
          (QList<QAbstractEventDispatcher::TimerInfoV2> *this)

{
  TimerInfoV2 *n;
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QAbstractEventDispatcher::TimerInfoV2> *)0x32a459);
  QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::operator->(in_RDI);
  n = QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::begin
                ((QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *)0x32a46a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }